

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

bool __thiscall
nivalis::anon_unknown_3::Differentiator::diff
          (Differentiator *this,ASTNode **ast,uint32_t diff_arg_id)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  ASTNode *pAVar5;
  reference pvVar6;
  uint in_EDX;
  _OpCode opcode_00;
  Differentiator *in_RSI;
  long in_RDI;
  double dVar7;
  pair<std::__detail::_Node_iterator<const_nivalis::Expr::ASTNode_*,_true,_false>,_bool> pVar8;
  ASTNode *tmp_28;
  ASTNode *tmp_27;
  ASTNode *tmp_26;
  ASTNode *tmp_25;
  ASTNode *tmp_24;
  ASTNode *tmp_23;
  ASTNode *tmp_22;
  ASTNode *tmp_21;
  ASTNode *tmp_20;
  ASTNode *tmp_19;
  ASTNode *tmp_18;
  ASTNode *tmp_17;
  ASTNode *tmp_16;
  ASTNode *tmp_15;
  ASTNode *tmp_14;
  ASTNode *tmp_13;
  ASTNode *tmp_12;
  ASTNode *tmp_11;
  ASTNode *tmp_10;
  ASTNode *tmp_9;
  ASTNode *tmp_8;
  bool idx_nonconst;
  ASTNode *tmp1_3;
  ASTNode *y_pos;
  ASTNode *x_pos;
  ASTNode *tmp_7;
  ASTNode *tmp_6;
  ASTNode *tmp_5;
  bool base_nonconst;
  ASTNode *tmp_4;
  ASTNode *tmp_3;
  ASTNode *elnbptr;
  AST elnb;
  ASTNode *base_pos;
  bool expo_nonconst;
  ASTNode *expon_pos;
  ASTNode *tmp1_2;
  ASTNode *tmp2_1;
  ASTNode *tmp1b;
  ASTNode *tmp1_1;
  ASTNode *tmp1;
  ASTNode *tmp2;
  ASTNode *tmp_2;
  int64_t j;
  int64_t i_3;
  AST diff_tmp_1;
  int64_t step_1;
  int64_t b_1;
  int64_t a_1;
  uint64_t var_id_1;
  ASTNode *tmp_1;
  int64_t i_2;
  AST diff_tmp;
  int64_t step;
  int64_t b;
  int64_t a;
  uint64_t var_id;
  ASTNode *f_astptr_1;
  size_t i_1;
  ASTNode *f_astptr;
  size_t i;
  ASTNode *tmp;
  vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
  call_args;
  Expr *fexpr;
  size_t n_args;
  uint32_t fid;
  uint32_t opcode;
  value_type *in_stack_ffffffffffffeeb8;
  value_type *__x;
  unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
  *in_stack_ffffffffffffeec0;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *this_00;
  value_type *in_stack_ffffffffffffeec8;
  Differentiator *in_stack_ffffffffffffeed0;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out;
  ASTNode *in_stack_ffffffffffffeed8;
  Differentiator *in_stack_ffffffffffffeee0;
  Differentiator *this_01;
  uint64_t in_stack_ffffffffffffeee8;
  ASTNode **in_stack_ffffffffffffeef0;
  double local_c50;
  double local_c38;
  ASTNode local_c10;
  ASTNode local_c00;
  ASTNode local_bf0;
  ASTNode local_be0;
  ASTNode local_bd0;
  ASTNode local_bc0;
  ASTNode local_bb0;
  ASTNode local_ba0;
  ASTNode local_b90;
  ASTNode local_b80;
  ASTNode local_b70;
  ASTNode local_b60;
  ASTNode local_b50;
  ASTNode local_b40;
  ASTNode local_b30;
  ASTNode local_b20;
  ASTNode local_b10;
  ASTNode local_b00;
  AST *local_af0;
  ASTNode local_ae8;
  ASTNode local_ad8;
  AST *local_ac8;
  ASTNode local_ac0;
  ASTNode local_ab0;
  ASTNode local_aa0;
  AST *local_a90;
  ASTNode local_a88;
  ASTNode local_a78;
  AST *local_a68;
  ASTNode local_a60;
  ASTNode local_a50;
  ASTNode local_a40;
  ASTNode local_a30;
  AST *local_a20;
  ASTNode local_a18;
  ASTNode local_a08;
  ASTNode local_9f8;
  ASTNode local_9e8;
  ASTNode local_9d8;
  AST *local_9c8;
  ASTNode local_9c0;
  ASTNode local_9b0;
  AST *local_9a0;
  ASTNode local_998;
  ASTNode local_988;
  AST *local_978;
  ASTNode local_970;
  ASTNode local_960;
  ASTNode local_950;
  ASTNode local_940;
  ASTNode local_930;
  ASTNode local_920;
  AST *local_910;
  ASTNode local_908;
  ASTNode local_8f8;
  ASTNode local_8e8;
  ASTNode local_8d8;
  ASTNode local_8c8;
  ASTNode local_8b8;
  ASTNode local_8a8;
  ASTNode local_898;
  AST *local_888;
  ASTNode local_880;
  ASTNode local_870;
  ASTNode local_860;
  ASTNode local_850;
  AST *local_840;
  ASTNode local_838;
  ASTNode local_828;
  ASTNode local_818;
  AST *local_808;
  ASTNode local_800;
  ASTNode local_7f0;
  AST *local_7e0;
  ASTNode local_7d8;
  ASTNode local_7c8;
  ASTNode local_7b8;
  ASTNode local_7a8;
  ASTNode local_798;
  AST *local_788;
  ASTNode local_780;
  ASTNode local_770;
  ASTNode local_760;
  ASTNode local_750;
  ASTNode local_740;
  AST *local_730;
  ASTNode local_728;
  ASTNode local_718;
  ASTNode local_708;
  AST *local_6f8;
  ASTNode local_6f0;
  ASTNode local_6e0;
  ASTNode local_6d0;
  ASTNode local_6c0;
  AST *local_6b0;
  ASTNode local_6a8;
  ASTNode local_698;
  AST *local_688;
  ASTNode local_680;
  ASTNode local_670;
  ASTNode local_660;
  ASTNode local_650;
  AST *local_640;
  ASTNode local_638;
  ASTNode local_628;
  ASTNode local_618;
  ASTNode local_608;
  ASTNode local_5f8;
  AST *local_5e8;
  ASTNode local_5e0;
  ASTNode local_5d0;
  ASTNode local_5c0;
  ASTNode local_5b0;
  ASTNode local_5a0;
  ASTNode local_590;
  ASTNode local_580;
  AST *local_570;
  undefined1 local_561;
  AST *local_560;
  ASTNode local_558;
  ASTNode local_548;
  ASTNode local_538;
  ASTNode local_528;
  ASTNode local_518;
  ASTNode local_508;
  ASTNode local_4f8;
  ASTNode local_4e8;
  ASTNode local_4d8;
  ASTNode local_4c8;
  ASTNode local_4b8;
  ASTNode local_4a8;
  ASTNode local_498;
  ASTNode local_488;
  ASTNode local_478;
  AST *local_468;
  AST *local_460;
  AST *local_458;
  ASTNode local_450;
  AST *local_440;
  ASTNode local_438;
  ASTNode local_428;
  ASTNode local_418;
  ASTNode local_408;
  ASTNode local_3f8;
  ASTNode local_3e8;
  ASTNode local_3d8;
  AST *local_3c8;
  undefined1 local_3b9;
  AST *local_3b8;
  ASTNode local_3b0;
  ASTNode local_3a0;
  ASTNode local_390;
  ASTNode local_380;
  ASTNode local_370;
  AST *local_360;
  ASTNode local_358;
  ASTNode local_348;
  reference local_338;
  ASTNode local_330;
  ASTNode local_320;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_310;
  AST *local_2f8;
  undefined1 local_2e9;
  AST *local_2e8;
  AST *local_2e0;
  ASTNode local_2d8;
  ASTNode local_2c8;
  AST *local_2b8;
  ASTNode local_2b0;
  AST *local_2a0;
  AST *local_298;
  ASTNode local_290;
  ASTNode local_280;
  ASTNode local_270;
  ASTNode local_260;
  AST *local_250;
  ASTNode local_248;
  ASTNode local_238;
  AST *local_228;
  reference local_220;
  ASTNode local_218;
  long local_208;
  ASTNode local_200;
  long local_1f0;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_1e8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  pointer local_1b8;
  uint local_1ac;
  ASTNode local_1a8;
  reference local_198;
  long local_190;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_188;
  long local_170;
  long local_168;
  long local_160;
  pointer local_158;
  ASTNode local_150;
  const_reference local_140;
  _Node_iterator_base<const_nivalis::Expr::ASTNode_*,_false> local_138;
  undefined1 local_130;
  const_reference local_128;
  const_reference local_120;
  ASTNode local_118;
  ASTNode local_108;
  ulong local_f8;
  const_reference local_f0;
  _Node_iterator_base<const_nivalis::Expr::ASTNode_*,_false> local_e8;
  undefined1 local_e0;
  const_reference local_d8;
  const_reference local_d0;
  ASTNode local_c8;
  size_type local_b8;
  ASTNode *local_b0;
  vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
  local_98;
  const_reference local_80;
  Expr *local_78;
  size_t local_70;
  uint local_64;
  ASTNode local_60;
  ASTNode local_50;
  ASTNode local_40;
  undefined4 in_stack_ffffffffffffffdc;
  uint32_t opcode_01;
  byte local_1;
  
  if (in_RSI == (Differentiator *)0x0) {
    in_RSI = (Differentiator *)(in_RDI + 8);
  }
  opcode_01 = *(uint32_t *)
               &(in_RSI->nodes->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_start;
  in_RSI->nodes =
       (AST *)&(in_RSI->nodes->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (opcode_01 == 0) {
    Expr::ASTNode::ASTNode((ASTNode *)&stack0xffffffffffffffd0,null);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
  }
  else if (opcode_01 == 1) {
    Expr::ASTNode::ASTNode(&local_40,0.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
  }
  else if (opcode_01 == 2) {
    local_c38 = 1.0;
    if (in_RSI->nodes[-1].
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != *(pointer *)(in_RDI + 0x10)) {
      local_c38 = 0.0;
    }
    Expr::ASTNode::ASTNode(&local_50,local_c38);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
  }
  else if (opcode_01 == 3) {
    local_c50 = 1.0;
    if (in_RSI->nodes[-1].
        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)(ulong)in_EDX) {
      local_c50 = 0.0;
    }
    Expr::ASTNode::ASTNode(&local_60,local_c50);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
  }
  else if (opcode_01 == 0xc) {
    local_64 = *(uint *)&in_RSI->nodes[-1].
                         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::
             vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                           *)(in_RDI + 0x60),(ulong)local_64);
    local_70 = pvVar3->n_args;
    pvVar3 = std::
             vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                           *)(in_RDI + 0x60),(ulong)local_64);
    local_78 = &pvVar3->expr;
    local_80 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](&local_78->ast,0);
    sVar4 = std::
            unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
            ::count(in_stack_ffffffffffffeec0,(key_type *)in_stack_ffffffffffffeeb8);
    if (sVar4 != 0) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    std::
    vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
    ::vector((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
              *)0x1358dd);
    std::
    vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
    ::resize((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
              *)in_stack_ffffffffffffeee0,(size_type)in_stack_ffffffffffffeed8);
    local_b0 = (ASTNode *)in_RSI->nodes;
    for (local_b8 = 0; local_b8 < local_70; local_b8 = local_b8 + 1) {
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::operator[](&local_98,local_b8);
      local_b0 = copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                          (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeed0);
    }
    std::
    vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                 *)in_stack_ffffffffffffeec0,(value_type *)in_stack_ffffffffffffeeb8);
    std::
    vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
    ::~vector((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
               *)in_stack_ffffffffffffeed0);
    if (local_70 != 0) {
      Expr::ASTNode::ASTNode(&local_c8,add);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
    }
    local_d0 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](&local_78->ast,0);
    local_d8 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](&local_78->ast,0);
    pVar8 = std::
            unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
            ::insert((unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
                      *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
    local_e8._M_cur =
         (__node_type *)
         pVar8.first.super__Node_iterator_base<const_nivalis::Expr::ASTNode_*,_false>._M_cur;
    local_e0 = pVar8.second;
    bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    local_f0 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](&local_78->ast,0);
    std::
    unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
    ::erase(in_stack_ffffffffffffeec0,(key_type *)in_stack_ffffffffffffeeb8);
    for (local_f8 = 0; local_f8 < local_70; local_f8 = local_f8 + 1) {
      if (local_f8 < local_70 - 1) {
        Expr::ASTNode::ASTNode(&local_108,add);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                  ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
      }
      Expr::ASTNode::ASTNode(&local_118,mul);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
      bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_120 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](&local_78->ast,0);
      local_128 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](&local_78->ast,0);
      pVar8 = std::
              unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
              ::insert((unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
                        *)in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
      local_138._M_cur =
           (__node_type *)
           pVar8.first.super__Node_iterator_base<const_nivalis::Expr::ASTNode_*,_false>._M_cur;
      local_130 = pVar8.second;
      bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
      if (!bVar1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_140 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](&local_78->ast,0);
      std::
      unordered_set<const_nivalis::Expr::ASTNode_*,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::allocator<const_nivalis::Expr::ASTNode_*>_>
      ::erase(in_stack_ffffffffffffeec0,(key_type *)in_stack_ffffffffffffeeb8);
    }
    std::
    vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
    ::pop_back((vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                *)0x135cff);
  }
  else if (opcode_01 == 0x10) {
    Expr::ASTNode::ASTNode(&local_150,bnz);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
    pAVar5 = copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                      (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                      in_stack_ffffffffffffeed0);
    in_RSI->nodes = (AST *)pAVar5;
    if (*(int *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start != 8) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    in_RSI->nodes =
         (AST *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
    begin_thunk(in_stack_ffffffffffffeed0);
    bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    end_thunk(in_stack_ffffffffffffeee0);
    if (*(int *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start != 9) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    in_RSI->nodes =
         (AST *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (*(int *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start != 8) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    in_RSI->nodes =
         (AST *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
    begin_thunk(in_stack_ffffffffffffeed0);
    bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    end_thunk(in_stack_ffffffffffffeee0);
    if (*(int *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start != 9) {
      local_1 = 0;
      goto LAB_00139af8;
    }
    in_RSI->nodes =
         (AST *)&(in_RSI->nodes->
                 super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    if (opcode_01 == 0x11) {
      local_158 = in_RSI->nodes[-1].
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_158 == *(pointer *)(in_RDI + 0x10)) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start != 1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_160 = (long)(double)(in_RSI->nodes->
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
      in_RSI->nodes =
           (AST *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start != 1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_168 = (long)(double)(in_RSI->nodes->
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
      in_RSI->nodes =
           (AST *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar2 = -1;
      if (local_160 <= local_168) {
        iVar2 = 1;
      }
      local_170 = (long)iVar2;
      local_168 = local_170 + local_168;
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start != 8) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      in_RSI->nodes =
           (AST *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x136006
                );
      for (local_190 = local_160; local_190 != local_168; local_190 = local_170 + local_190) {
        local_198 = (reference)in_RSI->nodes;
        if (local_190 + local_170 != local_168) {
          Expr::ASTNode::ASTNode(&local_1a8,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        }
        dVar7 = (double)local_190;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),
                            (size_type)local_158);
        *pvVar6 = dVar7;
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::clear
                  ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   0x136111);
        ast_sub_var(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                    (double)in_stack_ffffffffffffeee0,(AST *)in_stack_ffffffffffffeed8);
        local_198 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                    operator[](&local_188,0);
        bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
        if (!bVar1) {
          local_1 = 0;
          local_1ac = 1;
          goto LAB_0013620a;
        }
      }
      skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start == 9) {
        in_RSI->nodes =
             (AST *)&(in_RSI->nodes->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1ac = 0;
      }
      else {
        local_1 = 0;
        local_1ac = 1;
      }
LAB_0013620a:
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 in_stack_ffffffffffffeed0);
    }
    else {
      if (opcode_01 != 0x12) {
        if (opcode_01 == 0x18) {
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 - 0x20 < 2) {
          Expr::ASTNode::ASTNode(&local_238,opcode_01,0xffffffffffffffff);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 == 0x30) {
          Expr::ASTNode::ASTNode(&local_248,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          local_250 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_260,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_270,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x31) {
          Expr::ASTNode::ASTNode(&local_280,divi);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_290,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          local_298 = in_RSI->nodes;
          local_2a0 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_2b0,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          local_2b8 = in_RSI->nodes;
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_2c8,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          local_298 = local_2a0;
          Expr::ASTNode::ASTNode(&local_2d8,sqrb);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x32) {
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,0x32),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          bVar1 = ast_has_var((ASTNode **)in_stack_ffffffffffffeed8,
                              (uint64_t)in_stack_ffffffffffffeed0);
          if (bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 == 0x40) {
          local_2e0 = in_RSI->nodes;
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          local_2e8 = local_2e0;
          local_2e9 = ast_has_var((ASTNode **)in_stack_ffffffffffffeed8,
                                  (uint64_t)in_stack_ffffffffffffeed0);
          if ((bool)local_2e9) {
            local_2f8 = in_RSI->nodes;
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       0x136c08);
            Expr::ASTNode::ASTNode(&local_320,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
            Expr::ASTNode::ASTNode(&local_330,logb);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
            skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
            skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
            local_338 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ::operator[](&local_310,0);
            Expr::ASTNode::ASTNode(&local_348,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_358,expb);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
            }
            local_1ac = (uint)!bVar1;
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            goto joined_r0x00136220;
          }
          local_360 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_370,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_380,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_390,power);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_3a0,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_3b0,1.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x41) {
          local_3b8 = in_RSI->nodes;
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          local_3b9 = ast_has_var((ASTNode **)in_stack_ffffffffffffeed8,
                                  (uint64_t)in_stack_ffffffffffffeed0);
          if ((bool)local_3b9) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          local_3c8 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_3d8,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_3e8,divi);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_3f8,1.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_408,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_418,logb);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 - 0x50 < 2) {
          Expr::ASTNode::ASTNode(&local_428,bnz);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          opcode_00 = le;
          if (opcode_01 == 0x50) {
            opcode_00 = ge;
          }
          Expr::ASTNode::ASTNode(&local_438,opcode_00);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          local_440 = in_RSI->nodes;
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          begin_thunk(in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          end_thunk(in_stack_ffffffffffffeee0);
          begin_thunk(in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          end_thunk(in_stack_ffffffffffffeee0);
        }
        else if (((opcode_01 - 0x52 < 3) || (opcode_01 - 0x60 < 6)) || (opcode_01 - 0x4000 < 5)) {
          Expr::ASTNode::ASTNode(&local_450,0.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x4005) {
          local_458 = in_RSI->nodes;
          local_460 = in_RSI->nodes;
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          local_468 = local_458;
          Expr::ASTNode::ASTNode(&local_478,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_488,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_498,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_4a8,betab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_4b8,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_4c8,digammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_4d8,digammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_4e8,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_4f8,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_508,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_518,betab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_528,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_538,digammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_548,digammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_558,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 == 0x4006) {
          local_560 = in_RSI->nodes;
          local_561 = ast_has_var((ASTNode **)in_stack_ffffffffffffeed8,
                                  (uint64_t)in_stack_ffffffffffffeed0);
          if ((bool)local_561) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          local_560 = in_RSI->nodes;
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
          local_570 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_580,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_590,polygammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_5a0,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_5b0,1.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x8000) {
          Expr::ASTNode::ASTNode(&local_5c0,unaryminus);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 == 0x8001) {
LAB_00137f24:
          Expr::ASTNode::ASTNode(&local_680,0.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
        }
        else if (opcode_01 == 0x8002) {
          Expr::ASTNode::ASTNode(&local_5d0,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_5e0,sgn);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
        }
        else if (opcode_01 == 0x8003) {
          local_5e8 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_5f8,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_608,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_618,0.5);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_628,power);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
          Expr::ASTNode::ASTNode(&local_638,-0.5);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        }
        else if (opcode_01 == 0x8004) {
          local_640 = in_RSI->nodes;
          Expr::ASTNode::ASTNode(&local_650,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
          if (!bVar1) {
            local_1 = 0;
            goto LAB_00139af8;
          }
          Expr::ASTNode::ASTNode(&local_660,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          Expr::ASTNode::ASTNode(&local_670,2.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                    ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                   (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                   in_stack_ffffffffffffeed0);
        }
        else {
          if (opcode_01 - 0x8005 < 4) goto LAB_00137f24;
          if (opcode_01 == 0x8009) {
            local_688 = in_RSI->nodes;
            Expr::ASTNode::ASTNode(&local_698,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00139af8;
            }
            Expr::ASTNode::ASTNode(&local_6a8,expb);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
          }
          else if (opcode_01 == 0x800a) {
            local_6b0 = in_RSI->nodes;
            Expr::ASTNode::ASTNode(&local_6c0,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00139af8;
            }
            Expr::ASTNode::ASTNode(&local_6d0,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            dVar7 = log(2.0);
            Expr::ASTNode::ASTNode(&local_6e0,dVar7);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_6f0,exp2b);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
          }
          else if (opcode_01 == 0x800b) {
            local_6f8 = in_RSI->nodes;
            Expr::ASTNode::ASTNode(&local_708,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00139af8;
            }
            Expr::ASTNode::ASTNode(&local_718,divi);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_728,1.0);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
          }
          else if (opcode_01 == 0x800c) {
            local_788 = in_RSI->nodes;
            Expr::ASTNode::ASTNode(&local_798,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00139af8;
            }
            Expr::ASTNode::ASTNode(&local_7a8,divi);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_7b8,1.0);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_7c8,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            dVar7 = log(10.0);
            Expr::ASTNode::ASTNode(&local_7d8,dVar7);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
          }
          else if (opcode_01 == 0x800d) {
            local_730 = in_RSI->nodes;
            Expr::ASTNode::ASTNode(&local_740,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
            if (!bVar1) {
              local_1 = 0;
              goto LAB_00139af8;
            }
            Expr::ASTNode::ASTNode(&local_750,divi);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_760,1.0);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            Expr::ASTNode::ASTNode(&local_770,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            dVar7 = log(2.0);
            Expr::ASTNode::ASTNode(&local_780,dVar7);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                     in_stack_ffffffffffffeed0);
          }
          else {
            if (opcode_01 == 0x800e) goto LAB_00137f24;
            if (opcode_01 == 0x800f) {
              local_7e0 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_7f0,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_800,cosb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8010) {
              local_808 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_818,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_828,unaryminus);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_838,sinb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8011) {
              local_840 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_850,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_860,power);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_870,cosb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
              Expr::ASTNode::ASTNode(&local_880,-2.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            }
            else if (opcode_01 - 0x8012 < 2) {
              local_888 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_898,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              if (opcode_01 == 0x8013) {
                Expr::ASTNode::ASTNode(&local_8a8,unaryminus);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              }
              Expr::ASTNode::ASTNode(&local_8b8,divi);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_8c8,1.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_8d8,sqrtb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_8e8,sub);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_8f8,1.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_908,sqrb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8014) {
              local_910 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_920,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_930,divi);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_940,1.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_950,add);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_960,1.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_970,sqrb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8015) {
              local_978 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_988,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_998,coshb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8016) {
              local_9a0 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_9b0,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_9c0,sinhb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8017) {
              local_9c8 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_9d8,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_9e8,sub);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_9f8,1.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_a08,sqrb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_a18,tanhb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8018) {
              local_a20 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_a30,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_a40,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_a50,tgammab);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
              Expr::ASTNode::ASTNode(&local_a60,digammab);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x8019) {
              local_ac8 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_ad8,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_ae8,digammab);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x801a) {
              local_a68 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_a78,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_a88,trigammab);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x801b) {
              local_a90 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_aa0,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_ab0,polygammab);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_ac0,2.0);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else if (opcode_01 == 0x801c) {
              local_af0 = in_RSI->nodes;
              Expr::ASTNode::ASTNode(&local_b00,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              Expr::ASTNode::ASTNode(&local_b10,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              dVar7 = sqrt(3.141592653589793);
              Expr::ASTNode::ASTNode(&local_b20,2.0 / dVar7);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_b30,expb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_b40,unaryminus);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              Expr::ASTNode::ASTNode(&local_b50,sqrb);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
              copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeed0);
            }
            else {
              if (opcode_01 == 0x801d) {
                local_1 = 0;
                goto LAB_00139af8;
              }
              if (opcode_01 == 0x801e) {
                Expr::ASTNode::ASTNode(&local_b60,mul);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                Expr::ASTNode::ASTNode(&local_b70,mul);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                Expr::ASTNode::ASTNode(&local_b80,sigmoidb);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                         (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_stack_ffffffffffffeed0);
                Expr::ASTNode::ASTNode(&local_b90,sub);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                Expr::ASTNode::ASTNode(&local_ba0,1.0);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                Expr::ASTNode::ASTNode(&local_bb0,sigmoidb);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                         (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_stack_ffffffffffffeed0);
                bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc
                            );
                if (!bVar1) {
                  local_1 = 0;
                  goto LAB_00139af8;
                }
              }
              else if (opcode_01 == 0x801f) {
                pAVar5 = *(ASTNode **)(in_RDI + 0x110);
                Expr::ASTNode::ASTNode(&local_bc0,mul);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                this_01 = *(Differentiator **)(in_RDI + 0x110);
                Expr::ASTNode::ASTNode(&local_bd0,sigmoidb);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
                copy_ast(this_01,pAVar5,
                         (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_stack_ffffffffffffeed0);
                bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc
                            );
                if (!bVar1) {
                  local_1 = 0;
                  goto LAB_00139af8;
                }
              }
              else if (opcode_01 == 0x8020) {
                __x = *(value_type **)(in_RDI + 0x110);
                Expr::ASTNode::ASTNode(&local_be0,mul);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )in_stack_ffffffffffffeec0,__x);
                this_00 = *(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                            **)(in_RDI + 0x110);
                Expr::ASTNode::ASTNode(&local_bf0,mul);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back(this_00,__x);
                Expr::ASTNode::ASTNode(&local_c00,unaryminus);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back(this_00,__x);
                copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                         (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_stack_ffffffffffffeed0);
                out = *(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> **)
                       (in_RDI + 0x110);
                Expr::ASTNode::ASTNode(&local_c10,gausspdfb);
                std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                push_back(this_00,__x);
                copy_ast(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,out);
                bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc
                            );
                if (!bVar1) {
                  local_1 = 0;
                  goto LAB_00139af8;
                }
              }
            }
          }
        }
        goto LAB_00139af0;
      }
      local_1b8 = in_RSI->nodes[-1].
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_1b8 == *(pointer *)(in_RDI + 0x10)) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start != 1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_1c0 = (long)(double)(in_RSI->nodes->
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
      in_RSI->nodes =
           (AST *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start != 1) {
        local_1 = 0;
        goto LAB_00139af8;
      }
      local_1c8 = (long)(double)(in_RSI->nodes->
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
      in_RSI->nodes =
           (AST *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar2 = -1;
      if (local_1c0 <= local_1c8) {
        iVar2 = 1;
      }
      local_1d0 = (long)iVar2;
      local_1c8 = local_1d0 + local_1c8;
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)0x136347
                );
      if (*(int *)&(in_RSI->nodes->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start == 8) {
        in_RSI->nodes =
             (AST *)&(in_RSI->nodes->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (local_1f0 = local_1c0; local_1f0 != local_1c8; local_1f0 = local_1d0 + local_1f0) {
          if (local_1f0 + local_1d0 != local_1c8) {
            Expr::ASTNode::ASTNode(&local_200,add);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
          }
          for (local_208 = local_1c0; local_208 != local_1c8; local_208 = local_1d0 + local_208) {
            if (local_208 + local_1d0 != local_1c8) {
              Expr::ASTNode::ASTNode(&local_218,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              push_back((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                        in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
            }
            if (local_208 == local_1f0) {
              dVar7 = (double)local_1f0;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x30),
                                  (size_type)local_1b8);
              *pvVar6 = dVar7;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::clear
                        ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         0x136513);
              local_220 = (reference)in_RSI->nodes;
              ast_sub_var(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                          (double)in_stack_ffffffffffffeee0,(AST *)in_stack_ffffffffffffeed8);
              local_220 = std::
                          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                          operator[](&local_1e8,0);
              bVar1 = diff(in_RSI,(ASTNode **)CONCAT44(in_EDX,opcode_01),in_stack_ffffffffffffffdc);
              if (!bVar1) {
                local_1 = 0;
                local_1ac = 1;
                goto LAB_00136688;
              }
            }
            else {
              local_228 = in_RSI->nodes;
              ast_sub_var(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                          (double)in_stack_ffffffffffffeee0,(AST *)in_stack_ffffffffffffeed8);
            }
          }
        }
        skip_ast((ASTNode **)in_stack_ffffffffffffeed0);
        if (*(int *)&(in_RSI->nodes->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_start == 9) {
          in_RSI->nodes =
               (AST *)&(in_RSI->nodes->
                       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1ac = 0;
        }
        else {
          local_1 = 0;
          local_1ac = 1;
        }
      }
      else {
        local_1 = 0;
        local_1ac = 1;
      }
LAB_00136688:
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                 in_stack_ffffffffffffeed0);
    }
joined_r0x00136220:
    if (local_1ac != 0) goto LAB_00139af8;
  }
LAB_00139af0:
  local_1 = 1;
LAB_00139af8:
  return (bool)(local_1 & 1);
}

Assistant:

bool diff(const Expr::ASTNode** ast = nullptr, uint32_t diff_arg_id = -1) {
        if (ast == nullptr) ast = &ast_root;
        using namespace OpCode;
        uint32_t opcode = (*ast)->opcode;
        // std::cout << opcode << " " << diff_arg_id << " " << out.size() << " :: ";
        // for (auto& i : out) { std::cout << i.opcode << " "; }
        // std::cout << "\n";
        ++*ast;
        switch(opcode) {
            case null: PUSH(null); break;
            case val: PUSH(0.); break;
            case ref: PUSH(((*ast)-1)->ref == var_addr ? 1. : 0.); break;
            case arg: PUSH(((*ast)-1)->ref == diff_arg_id ? 1. : 0.); break;
            case call:
                      {
                          uint32_t fid = ((*ast)-1)->call_info[0];
                          size_t n_args = env.funcs[fid].n_args;

                          const auto& fexpr = env.funcs[fid].expr;
                          if (vis_asts.count(&fexpr.ast[0])) {
                              // Prevent recursion/cycles
                              return false;
                          }
                          {
                              std::vector<Expr::AST> call_args;
                              call_args.resize(n_args);
                              const Expr::ASTNode* tmp = *ast;
                              for (size_t i = 0; i < n_args; ++i) {
                                  tmp = copy_ast(tmp, call_args[i]);
                              }
                              argv.push_back(std::move(call_args));
                          }
                          {
                              if (n_args > 0) out.push_back(add);
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr)) {
                                  return false;
                              }
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          for (size_t i = 0; i < n_args; ++i) {
                              if (i < n_args - 1) out.push_back(add);
                              out.push_back(mul);
                              DIFF_NEXT;
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr, (uint32_t)i)) return false;
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          argv.pop_back();
                      }
                      break;
            case bnz:
                      {
                          PUSH(bnz);
                          *ast = copy_ast(*ast, out);
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case sums:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          Expr::AST diff_tmp;
                          for (int64_t i = a; i != b; i += step) {
                              const Expr::ASTNode* tmp = *ast;
                              if (i + step != b) PUSH(OpCode::add);
                              env.vars[var_id] = static_cast<double>(i);
                              diff_tmp.clear();
                              ast_sub_var(&tmp, var_id, static_cast<double>(i), diff_tmp);
                              tmp = &diff_tmp[0];
                              if (!diff(&tmp, diff_arg_id)) return false;
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case prods:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          Expr::AST diff_tmp;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          for (int64_t i = a; i != b; i += step) {
                              if (i + step != b) PUSH(OpCode::add);
                              for (int64_t j = a; j != b; j += step) {
                                  if (j + step != b) PUSH(OpCode::mul);
                                  if (j == i) {
                                      env.vars[var_id] = static_cast<double>(i);
                                      diff_tmp.clear();
                                      const Expr::ASTNode* tmp = *ast;
                                      ast_sub_var(&tmp, var_id, static_cast<double>(j), diff_tmp);
                                      tmp = &diff_tmp[0];
                                      if (!diff(&tmp, diff_arg_id)) return false;
                                  } else {
                                      const Expr::ASTNode* tmp2 = *ast;
                                      ast_sub_var(&tmp2, var_id, static_cast<double>(j), out);
                                  }
                              }
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;

            case bsel: skip_ast(ast); DIFF_NEXT; break;
            case add: case sub: PUSH(opcode); DIFF_NEXT; DIFF_NEXT; break;
            case mul: {
                          // Product rule
                          PUSH(add);
                          const Expr::ASTNode* tmp1 = *ast;
                          PUSH(mul); DIFF_NEXT; // df *
                          copy_ast(*ast, out); // g
                          PUSH(mul);
                          DIFF_NEXT;
                          copy_ast(tmp1, out); // + dg * f
                      }
                break;
            case divi: {
                          // Quotient rule
                          PUSH(divi); PUSH(sub);
                          const Expr::ASTNode* tmp1 = *ast, *tmp1b = *ast;
                          PUSH(mul); DIFF_NEXT;  // df *
                          const Expr::ASTNode* tmp2 = *ast;
                          copy_ast(tmp2, out);  // g
                          PUSH(mul); DIFF_NEXT; copy_ast(tmp1, out); // - dg * f
                          tmp1 = tmp1b;
                          PUSH(sqrb); copy_ast(tmp2, out); // / g^2
                      }
                      break;
            case mod:
                      DIFF_NEXT;
                      // Cannot take derivative wrt modulus
                      if (ast_has_var(ast, var_addr)) return false;
                      break;

            case power:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          skip_ast(&tmp1);
                          const Expr::ASTNode* expon_pos = tmp1;
                          bool expo_nonconst = ast_has_var(&tmp1, var_addr);
                          if (expo_nonconst) {
                              const Expr::ASTNode* base_pos = *ast;
                              Expr::AST elnb;
                              elnb.push_back(mul);
                              copy_ast(expon_pos, elnb);
                              elnb.push_back(logb);
                              copy_ast(base_pos, elnb);
                              skip_ast(ast); skip_ast(ast);
                              const Expr::ASTNode* elnbptr = &elnb[0];
                              PUSH(mul); PUSH(expb);
                              copy_ast(elnbptr, out);
                              if (!diff(&elnbptr, diff_arg_id)) return false;
                          } else {
                              CHAIN_RULE(PUSH(mul);
                                      copy_ast(*ast, out);
                                      PUSH(power), // g(x) goes here
                                      PUSH(sub); copy_ast(*ast, out); PUSH(1.));
                              skip_ast(ast);
                          }
                      }
                      break;
            case logbase:
                      {
                          const Expr::ASTNode* tmp = *ast;
                          skip_ast(&tmp);
                          bool base_nonconst = ast_has_var(&tmp, var_addr);
                          // Cannot take derivative wrt base
                          if (base_nonconst) return false;
                          CHAIN_RULE(PUSH(divi);
                                  PUSH(1.0);PUSH(mul);
                                  PUSH(logb);
                                  copy_ast(*ast, out),);
                          skip_ast(ast);
                      }
                      break;
            case max: case min:
                      {
                          PUSH(bnz); PUSH(opcode == max ? ge : le);
                          const Expr::ASTNode* tmp = *ast;
                          copy_ast(tmp, out);
                          skip_ast(&tmp); copy_ast(tmp, out);
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          break;
                      }
            case land: case lor: case lxor: case gcd: case lcm: case choose: case fafact: case rifact:
            case lt: case le: case eq: case ne: case ge: case gt:
                      PUSH(0.0); skip_ast(ast); skip_ast(ast); // Integer functions: 0 derivative
                      break;
            case betab:
                      {
                          const Expr::ASTNode* tmp = *ast, *x_pos = *ast;
                          skip_ast(&tmp);
                          const Expr::ASTNode* y_pos = tmp;
                          PUSH(add);
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(x_pos,out);
                          PUSH(digammab); PUSH(add);
                          copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(y_pos,out);
                          PUSH(digammab); PUSH(add); copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                      }
                      break;
            case polygammab:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          bool idx_nonconst = ast_has_var(&tmp1, var_addr);
                          if (idx_nonconst) return false; // Can't differentiate wrt polygamma index
                          tmp1 = *ast;
                          skip_ast(ast);
                          CHAIN_RULE(PUSH(polygammab);
                                  PUSH(add);
                                  copy_ast(tmp1, out);
                                  PUSH(1.),);
                      }
                      break;
            case unaryminus: PUSH(unaryminus); DIFF_NEXT; break;
            case absb: {
                           PUSH(mul); PUSH(sgn);
                           copy_ast(*ast, out);
                           DIFF_NEXT;
                       }
                             break;
            case sqrtb: CHAIN_RULE(
                                PUSH(mul);
                                PUSH(0.5);
                                PUSH(power), // g(x) goes here
                                PUSH(-0.5)); break;
            case sqrb: CHAIN_RULE(PUSH(mul); PUSH(2.),); break;
            case lnot: case sgn: case floorb: case ceilb: case roundb: case factb:
                       PUSH(0.0); skip_ast(ast); break; // Integer functions; 0 derivative
            case expb: CHAIN_RULE(PUSH(expb),); break;
            case exp2b: CHAIN_RULE( PUSH(mul); PUSH(log(2.)); PUSH(exp2b),); break;
            case logb:  CHAIN_RULE(PUSH(divi);PUSH(1.0),); break;
            case log2b:  CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(2));,); break;
            case log10b: CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(10));,); break;
            case sinb:  CHAIN_RULE(PUSH(cosb),); break;
            case cosb:  CHAIN_RULE(PUSH(unaryminus); PUSH(sinb),); break;
            case tanb:  CHAIN_RULE(PUSH(power); PUSH(cosb);
                                ,PUSH(-2.)); break;
            case asinb: case acosb:
                        CHAIN_RULE(if (opcode == acosb) PUSH(unaryminus);
                                PUSH(divi); PUSH(1.);
                                PUSH(sqrtb); PUSH(sub); PUSH(1.); PUSH(sqrb),); break;
            case atanb:  CHAIN_RULE(PUSH(divi); PUSH(1.); PUSH(add); PUSH(1.); PUSH(sqrb),); break;
            case sinhb: CHAIN_RULE(PUSH(coshb),); break;
            case coshb: CHAIN_RULE(PUSH(sinhb),); break;
            case tanhb: CHAIN_RULE(PUSH(sub); PUSH(1.); PUSH(sqrb); PUSH(tanhb),); break;
            case tgammab:
                        {
                            const Expr::ASTNode* tmp = *ast;
                            out.push_back(mul); DIFF_NEXT;
                            PUSH(mul); PUSH(tgammab); copy_ast(tmp, out);
                            PUSH(digammab); copy_ast(tmp, out);
                        }
                        break;
            case digammab: CHAIN_RULE(PUSH(trigammab),); break;
            case trigammab: CHAIN_RULE(PUSH(polygammab); PUSH(2.),); break;
            case lgammab: CHAIN_RULE(PUSH(digammab),); break;
            case erfb:   CHAIN_RULE(
                                 PUSH(mul); PUSH(2.0 / sqrt(M_PI));
                                 PUSH(expb); PUSH(unaryminus); PUSH(sqrb),);
                         break;
            case sigmoidb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            PUSH(sub);
                            PUSH(1.);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                        ; 
                        break;
            case softplusb: 
                         {
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case gausspdfb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(unaryminus);
                            copy_ast(*ast, out);
                            PUSH(gausspdfb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case zetab:  return false; // Derivative not available
        }
        return true;
    }